

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int lj_cf_ffi_typeof(lua_State *L)

{
  TValue *pTVar1;
  CTypeID CVar2;
  void *pvVar3;
  ulong uVar4;
  CTState *cts;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  cts->L = L;
  CVar2 = ffi_checkctype(L,cts,L->base + 1);
  pvVar3 = lj_mem_newgco(cts->L,0xc);
  *(undefined1 *)((long)pvVar3 + 5) = 10;
  *(undefined2 *)((long)pvVar3 + 6) = 0x15;
  *(CTypeID *)((long)pvVar3 + 8) = CVar2;
  pTVar1 = L->top;
  pTVar1[-1].u32.lo = (uint32_t)pvVar3;
  *(undefined4 *)((long)pTVar1 + -4) = 0xfffffff5;
  uVar4 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar4 + 0x24) <= *(uint *)(uVar4 + 0x20)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_typeof)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, L->base+1);
  GCcdata *cd = lj_cdata_new(cts, CTID_CTYPEID, 4);
  *(CTypeID *)cdataptr(cd) = id;
  setcdataV(L, L->top-1, cd);
  lj_gc_check(L);
  return 1;
}